

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  long lVar1;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  paf;
  FixVoid<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  local_48;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  local_38;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar1 + 0x18) == 0) && (*(char *)(lVar1 + 0x120) == '\0')) {
    *(undefined1 *)(lVar1 + 0x120) = 1;
    local_48.disposer = (Disposer *)(lVar1 + 0x160);
    *(int *)(lVar1 + 0x178) = *(int *)(lVar1 + 0x178) + 1;
    local_48.ptr = (Connection *)(lVar1 + 8);
    kj::
    Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
    ::Promise((Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
               *)this,&local_48);
    kj::
    Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>
    ::dispose(&local_48);
  }
  else {
    kj::
    newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
              ();
    kj::
    Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>_>
    ::operator=((Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>_>
                 *)(lVar1 + 0x140),&local_38.fulfiller);
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         (_func_int **)local_38.promise.super_PromiseBase.node.disposer;
    (this->super_Connection).super_Connection._vptr_Connection =
         (_func_int **)local_38.promise.super_PromiseBase.node.ptr;
    local_38.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::
    PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
    ::~PromiseFulfillerPair(&local_38);
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}